

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::accumulateScaleFactors
          (BeagleCPUImpl<double,_2,_0> *this,int *scalingIndices,int count,
          int cumulativeScalingIndex)

{
  undefined1 auVar1 [16];
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  short **ppsVar5;
  int *piVar6;
  short *psVar7;
  int j;
  long lVar8;
  ulong uVar9;
  int j_1;
  ulong uVar10;
  ulong uVar11;
  double __x;
  undefined1 auVar12 [16];
  undefined8 in_XMM2_Qb;
  
  if ((this->kFlags & 0x80) == 0) {
    pdVar3 = this->gScaleBuffers[cumulativeScalingIndex];
    for (uVar11 = 0; uVar11 != (uint)(~(count >> 0x1f) & count); uVar11 = uVar11 + 1) {
      pdVar4 = this->gScaleBuffers[scalingIndices[uVar11]];
      for (lVar8 = 0; lVar8 < this->kPatternCount; lVar8 = lVar8 + 1) {
        __x = pdVar4[lVar8];
        if ((this->kFlags & 0x400) == 0) {
          __x = log(__x);
        }
        pdVar3[lVar8] = __x + pdVar3[lVar8];
      }
    }
  }
  else {
    pdVar3 = *this->gScaleBuffers;
    uVar11 = (ulong)(uint)(~(this->kPatternCount >> 0x1f) & this->kPatternCount);
    for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      pdVar3[uVar9] = 0.0;
    }
    iVar2 = this->kTipCount;
    ppsVar5 = this->gAutoScaleBuffers;
    piVar6 = this->gActiveScalingFactors;
    for (uVar9 = 0; uVar9 != (uint)(~(count >> 0x1f) & count); uVar9 = uVar9 + 1) {
      lVar8 = (long)scalingIndices[uVar9] - (long)iVar2;
      if (piVar6[lVar8] != 0) {
        psVar7 = ppsVar5[lVar8];
        for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
          auVar12._0_8_ = (double)(int)psVar7[uVar10];
          auVar12._8_8_ = in_XMM2_Qb;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = pdVar3[uVar10];
          auVar1 = vfmadd213sd_fma(auVar12,ZEXT816(0x3fe62e42fefa39ef),auVar1);
          pdVar3[uVar10] = auVar1._0_8_;
        }
      }
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateScaleFactors(const int* scalingIndices,
                                                int  count,
                                                int  cumulativeScalingIndex) {
    if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
        REALTYPE* cumulativeScaleBuffer = gScaleBuffers[0];
        for(int j=0; j<kPatternCount; j++)
            cumulativeScaleBuffer[j] =  0;
        for(int i=0; i<count; i++) {
            int sIndex = scalingIndices[i] - kTipCount;
            if (gActiveScalingFactors[sIndex]) {
                const signed short* scaleBuffer = gAutoScaleBuffers[sIndex];
                for(int j=0; j<kPatternCount; j++) {
                    cumulativeScaleBuffer[j] += M_LN2 * scaleBuffer[j];
                }
            }
        }

    } else {
        REALTYPE* cumulativeScaleBuffer = gScaleBuffers[cumulativeScalingIndex];
        for(int i=0; i<count; i++) {
            const REALTYPE* scaleBuffer = gScaleBuffers[scalingIndices[i]];
            for(int j=0; j<kPatternCount; j++) {
                if (kFlags & BEAGLE_FLAG_SCALERS_LOG)
                    cumulativeScaleBuffer[j] += scaleBuffer[j];
                else
                    cumulativeScaleBuffer[j] += log(scaleBuffer[j]);
            }
        }

        if (DEBUGGING_OUTPUT) {
            fprintf(stderr,"Accumulating %d scale buffers into #%d\n",count,cumulativeScalingIndex);
            for(int j=0; j<kPatternCount; j++) {
                fprintf(stderr,"cumulativeScaleBuffer[%d] = %2.5e\n",j,cumulativeScaleBuffer[j]);
            }
        }
    }

    return BEAGLE_SUCCESS;
}